

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CosineSeriesBendType.hpp
# Opt level: O0

void __thiscall
OpenMD::CosineSeriesBendType::CosineSeriesBendType
          (CosineSeriesBendType *this,RealType theta,RealType k)

{
  BendType *in_RDI;
  double in_XMM0_Qa;
  double dVar1;
  double dVar2;
  _func_int **in_XMM1_Qa;
  RealType ct;
  RealType st;
  
  BendType::BendType(in_RDI,in_XMM0_Qa);
  in_RDI->_vptr_BendType = (_func_int **)&PTR__CosineSeriesBendType_0034caa8;
  in_RDI[1]._vptr_BendType = in_XMM1_Qa;
  dVar1 = sin(in_XMM0_Qa);
  dVar2 = cos(in_XMM0_Qa);
  in_RDI[2].theta0_ = 1.0 / (dVar1 * 4.0 * dVar1);
  in_RDI[2]._vptr_BendType = (_func_int **)(in_RDI[2].theta0_ * -4.0 * dVar2);
  in_RDI[1].theta0_ = in_RDI[2].theta0_ * (dVar2 * 2.0 * dVar2 + 1.0);
  return;
}

Assistant:

CosineSeriesBendType(RealType theta, RealType k) : BendType(theta), k_(k) {
      RealType st = sin(theta);
      RealType ct = cos(theta);
      c2_         = 1.0 / (4.0 * st * st);
      c1_         = -4.0 * c2_ * ct;
      c0_         = c2_ * (2.0 * ct * ct + 1.0);
    }